

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_sendWithLookupReceiverType
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t result,sysbvm_tuple_t receiverLookupType,sysbvm_tuple_t selector,
          sysbvm_tuple_t receiver,sysbvm_tuple_t arguments)

{
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar1;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instructionObject;
  sysbvm_tuple_t sVar2;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar3;
  ulong uVar4;
  undefined8 uVar5;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  bVar8 = (arguments & 0xf) != 0;
  if (bVar8 || arguments == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (ulong)(*(uint *)(arguments + 0xc) >> 3);
  }
  sysbvm_functionBytecodeAssembler_countExtension(context,assembler,uVar7 >> 4);
  sVar2 = sysbvm_array_create(context,uVar7 + 4);
  bVar9 = (sVar2 & 0xf) == 0;
  if (bVar9 && sVar2 != 0) {
    *(sysbvm_tuple_t *)(sVar2 + 0x10) = result;
    *(sysbvm_tuple_t *)(sVar2 + 0x18) = receiverLookupType;
    *(sysbvm_tuple_t *)(sVar2 + 0x20) = selector;
    *(sysbvm_tuple_t *)(sVar2 + 0x28) = receiver;
  }
  if (uVar7 != 0) {
    uVar4 = 0;
    do {
      if (bVar8 || arguments == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(undefined8 *)(arguments + 0x10 + uVar4 * 8);
      }
      if (bVar9 && sVar2 != 0) {
        *(undefined8 *)(sVar2 + 0x30 + uVar4 * 8) = uVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar7 != uVar4);
  }
  psVar3 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)
           sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionBytecodeAssemblerInstruction,9);
  psVar3[1].super.header.field_0.typePointer = 0x703;
  psVar3[1].super.header.identityHashAndFlags = (int)sVar2;
  psVar3[1].super.header.objectSize = (int)(sVar2 >> 0x20);
  psVar1 = assembler->lastInstruction;
  ppsVar6 = &psVar1->next;
  if (psVar1 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    ppsVar6 = &assembler->firstInstruction;
  }
  psVar3->previous = psVar1;
  *ppsVar6 = psVar3;
  assembler->lastInstruction = psVar3;
  psVar3->sourceASTNode = assembler->sourceASTNode;
  sVar2 = assembler->sourceEnvironment;
  psVar3->sourcePosition = assembler->sourcePosition;
  psVar3->sourceEnvironment = sVar2;
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_sendWithLookupReceiverType(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t result, sysbvm_tuple_t receiverLookupType, sysbvm_tuple_t selector, sysbvm_tuple_t receiver, sysbvm_tuple_t arguments)
{
    size_t argumentCount = sysbvm_array_getSize(arguments);
    sysbvm_functionBytecodeAssembler_countExtension(context, assembler, argumentCount>>4);

    sysbvm_tuple_t operands = sysbvm_array_create(context, 4 + argumentCount);
    sysbvm_array_atPut(operands, 0, result);
    sysbvm_array_atPut(operands, 1, receiverLookupType);
    sysbvm_array_atPut(operands, 2, selector);
    sysbvm_array_atPut(operands, 3, receiver);
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_array_atPut(operands, 4 + i, sysbvm_array_at(arguments, i));
    
    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_SEND_WITH_LOOKUP, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}